

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O3

bool Omega_h::gmsh::anon_unknown_0::seek_optional_section(istream *stream,string *want)

{
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  string line;
  char *local_60;
  size_t local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 local_40;
  undefined8 local_38;
  
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    fail("assertion %s failed at %s +%d\n","stream",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x6e);
  }
  local_58 = 0;
  local_50 = '\0';
  local_60 = &local_50;
  auVar7 = std::istream::tellg();
LAB_002d4e94:
  do {
    local_40 = auVar7._8_8_;
    local_38 = auVar7._0_8_;
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_60,cVar2);
    auVar7._8_8_ = local_40;
    auVar7._0_8_ = local_38;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_002d4f1b;
    if (local_58 == want->_M_string_length) {
      bVar6 = true;
      if ((local_58 == 0) || (iVar3 = bcmp(local_60,(want->_M_dataplus)._M_p,local_58), iVar3 == 0))
      goto LAB_002d4f41;
    }
    else if (local_58 == 0) goto LAB_002d4e94;
    lVar5 = std::__cxx11::string::rfind((char *)&local_60,0x448ec6,0xffffffffffffffff);
    auVar1._8_8_ = local_40;
    auVar1._0_8_ = local_38;
    auVar7._8_8_ = local_40;
    auVar7._0_8_ = local_38;
    if ((lVar5 != 0) && (auVar7 = auVar1, *local_60 == '$')) {
LAB_002d4f1b:
      std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
      std::istream::seekg(stream,local_38,local_40);
      bVar6 = false;
LAB_002d4f41:
      if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
        fail("assertion %s failed at %s +%d\n","stream",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x80);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      }
      return bVar6;
    }
  } while( true );
}

Assistant:

static bool seek_optional_section(
    std::istream& stream, std::string const& want) {
  OMEGA_H_CHECK(stream);
  std::string line;
  auto const pos = stream.tellg();
  bool found = false;
  while (std::getline(stream, line)) {
    if (line == want) {
      found = true;
      break;
    }
    if (!line.empty() && line.rfind("$End") != 0 && line[0] == '$') {
      // found the beginning of a new section that is not the one expected
      break;
    }
  }
  if (!found) {
    stream.clear();
    stream.seekg(pos);
  }
  OMEGA_H_CHECK(stream);
  return found;
}